

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void walLimitSize(Wal *pWal,i64 nMax)

{
  int local_24;
  long lStack_20;
  int rx;
  i64 sz;
  i64 nMax_local;
  Wal *pWal_local;
  
  sz = nMax;
  nMax_local = (i64)pWal;
  sqlite3BeginBenignMalloc();
  local_24 = sqlite3OsFileSize(*(sqlite3_file **)(nMax_local + 0x10),&stack0xffffffffffffffe0);
  if ((local_24 == 0) && (sz < lStack_20)) {
    local_24 = sqlite3OsTruncate(*(sqlite3_file **)(nMax_local + 0x10),sz);
  }
  sqlite3EndBenignMalloc();
  if (local_24 != 0) {
    sqlite3_log(local_24,"cannot limit WAL size: %s",*(undefined8 *)(nMax_local + 0x80));
  }
  return;
}

Assistant:

static void walLimitSize(Wal *pWal, i64 nMax){
  i64 sz;
  int rx;
  sqlite3BeginBenignMalloc();
  rx = sqlite3OsFileSize(pWal->pWalFd, &sz);
  if( rx==SQLITE_OK && (sz > nMax ) ){
    rx = sqlite3OsTruncate(pWal->pWalFd, nMax);
  }
  sqlite3EndBenignMalloc();
  if( rx ){
    sqlite3_log(rx, "cannot limit WAL size: %s", pWal->zWalName);
  }
}